

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

GLenum gl4cts::Utils::getGLDataTypeOfVariableType(_variable_type type)

{
  TestError *this;
  GLenum local_10;
  GLenum result;
  _variable_type type_local;
  
  switch(type) {
  case VARIABLE_TYPE_BOOL:
    local_10 = 0x8b56;
    break;
  default:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Unrecognized variable type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x2e8);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  case VARIABLE_TYPE_DOUBLE:
    local_10 = 0x140a;
    break;
  case VARIABLE_TYPE_DMAT2:
    local_10 = 0x8f46;
    break;
  case VARIABLE_TYPE_DMAT2X3:
    local_10 = 0x8f49;
    break;
  case VARIABLE_TYPE_DMAT2X4:
    local_10 = 0x8f4a;
    break;
  case VARIABLE_TYPE_DMAT3:
    local_10 = 0x8f47;
    break;
  case VARIABLE_TYPE_DMAT3X2:
    local_10 = 0x8f4b;
    break;
  case VARIABLE_TYPE_DMAT3X4:
    local_10 = 0x8f4c;
    break;
  case VARIABLE_TYPE_DMAT4:
    local_10 = 0x8f48;
    break;
  case VARIABLE_TYPE_DMAT4X2:
    local_10 = 0x8f4d;
    break;
  case VARIABLE_TYPE_DMAT4X3:
    local_10 = 0x8f4e;
    break;
  case VARIABLE_TYPE_DVEC2:
    local_10 = 0x8ffc;
    break;
  case VARIABLE_TYPE_DVEC3:
    local_10 = 0x8ffd;
    break;
  case VARIABLE_TYPE_DVEC4:
    local_10 = 0x8ffe;
    break;
  case VARIABLE_TYPE_FLOAT:
    local_10 = 0x1406;
    break;
  case VARIABLE_TYPE_INT:
    local_10 = 0x1404;
    break;
  case VARIABLE_TYPE_IVEC2:
    local_10 = 0x8b53;
    break;
  case VARIABLE_TYPE_IVEC3:
    local_10 = 0x8b54;
    break;
  case VARIABLE_TYPE_IVEC4:
    local_10 = 0x8b55;
    break;
  case VARIABLE_TYPE_MAT2:
    local_10 = 0x8b5a;
    break;
  case VARIABLE_TYPE_MAT2X3:
    local_10 = 0x8b65;
    break;
  case VARIABLE_TYPE_MAT2X4:
    local_10 = 0x8b66;
    break;
  case VARIABLE_TYPE_MAT3:
    local_10 = 0x8b5b;
    break;
  case VARIABLE_TYPE_MAT3X2:
    local_10 = 0x8b67;
    break;
  case VARIABLE_TYPE_MAT3X4:
    local_10 = 0x8b68;
    break;
  case VARIABLE_TYPE_MAT4:
    local_10 = 0x8b5c;
    break;
  case VARIABLE_TYPE_MAT4X2:
    local_10 = 0x8b69;
    break;
  case VARIABLE_TYPE_MAT4X3:
    local_10 = 0x8b6a;
    break;
  case VARIABLE_TYPE_UINT:
    local_10 = 0x1405;
    break;
  case VARIABLE_TYPE_UVEC2:
    local_10 = 0x8dc6;
    break;
  case VARIABLE_TYPE_UVEC3:
    local_10 = 0x8dc7;
    break;
  case VARIABLE_TYPE_UVEC4:
    local_10 = 0x8dc8;
    break;
  case VARIABLE_TYPE_VEC2:
    local_10 = 0x8b50;
    break;
  case VARIABLE_TYPE_VEC3:
    local_10 = 0x8b51;
    break;
  case VARIABLE_TYPE_VEC4:
    local_10 = 0x8b52;
  }
  return local_10;
}

Assistant:

glw::GLenum Utils::getGLDataTypeOfVariableType(_variable_type type)
{
	glw::GLenum result = GL_NONE;

	switch (type)
	{
	case VARIABLE_TYPE_BOOL:
		result = GL_BOOL;
		break;
	case VARIABLE_TYPE_DOUBLE:
		result = GL_DOUBLE;
		break;
	case VARIABLE_TYPE_DMAT2:
		result = GL_DOUBLE_MAT2;
		break;
	case VARIABLE_TYPE_DMAT2X3:
		result = GL_DOUBLE_MAT2x3;
		break;
	case VARIABLE_TYPE_DMAT2X4:
		result = GL_DOUBLE_MAT2x4;
		break;
	case VARIABLE_TYPE_DMAT3:
		result = GL_DOUBLE_MAT3;
		break;
	case VARIABLE_TYPE_DMAT3X2:
		result = GL_DOUBLE_MAT3x2;
		break;
	case VARIABLE_TYPE_DMAT3X4:
		result = GL_DOUBLE_MAT3x4;
		break;
	case VARIABLE_TYPE_DMAT4:
		result = GL_DOUBLE_MAT4;
		break;
	case VARIABLE_TYPE_DMAT4X2:
		result = GL_DOUBLE_MAT4x2;
		break;
	case VARIABLE_TYPE_DMAT4X3:
		result = GL_DOUBLE_MAT4x3;
		break;
	case VARIABLE_TYPE_DVEC2:
		result = GL_DOUBLE_VEC2;
		break;
	case VARIABLE_TYPE_DVEC3:
		result = GL_DOUBLE_VEC3;
		break;
	case VARIABLE_TYPE_DVEC4:
		result = GL_DOUBLE_VEC4;
		break;
	case VARIABLE_TYPE_FLOAT:
		result = GL_FLOAT;
		break;
	case VARIABLE_TYPE_INT:
		result = GL_INT;
		break;
	case VARIABLE_TYPE_IVEC2:
		result = GL_INT_VEC2;
		break;
	case VARIABLE_TYPE_IVEC3:
		result = GL_INT_VEC3;
		break;
	case VARIABLE_TYPE_IVEC4:
		result = GL_INT_VEC4;
		break;
	case VARIABLE_TYPE_MAT2:
		result = GL_FLOAT_MAT2;
		break;
	case VARIABLE_TYPE_MAT2X3:
		result = GL_FLOAT_MAT2x3;
		break;
	case VARIABLE_TYPE_MAT2X4:
		result = GL_FLOAT_MAT2x4;
		break;
	case VARIABLE_TYPE_MAT3:
		result = GL_FLOAT_MAT3;
		break;
	case VARIABLE_TYPE_MAT3X2:
		result = GL_FLOAT_MAT3x2;
		break;
	case VARIABLE_TYPE_MAT3X4:
		result = GL_FLOAT_MAT3x4;
		break;
	case VARIABLE_TYPE_MAT4:
		result = GL_FLOAT_MAT4;
		break;
	case VARIABLE_TYPE_MAT4X2:
		result = GL_FLOAT_MAT4x2;
		break;
	case VARIABLE_TYPE_MAT4X3:
		result = GL_FLOAT_MAT4x3;
		break;
	case VARIABLE_TYPE_UINT:
		result = GL_UNSIGNED_INT;
		break;
	case VARIABLE_TYPE_UVEC2:
		result = GL_UNSIGNED_INT_VEC2;
		break;
	case VARIABLE_TYPE_UVEC3:
		result = GL_UNSIGNED_INT_VEC3;
		break;
	case VARIABLE_TYPE_UVEC4:
		result = GL_UNSIGNED_INT_VEC4;
		break;
	case VARIABLE_TYPE_VEC2:
		result = GL_FLOAT_VEC2;
		break;
	case VARIABLE_TYPE_VEC3:
		result = GL_FLOAT_VEC3;
		break;
	case VARIABLE_TYPE_VEC4:
		result = GL_FLOAT_VEC4;
		break;

	default:
	{
		TCU_FAIL("Unrecognized variable type");
	}
	}

	return result;
}